

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void reallymarkobject(global_State *g,GCObject *o)

{
  int iVar1;
  GCObject *o_00;
  Table *pTVar2;
  byte bVar3;
  UpVal *uv;
  
  do {
    bVar3 = (o->gch).marked & 0xfc;
    (o->gch).marked = bVar3;
    if ((o->gch).tt != '\a') {
      switch((o->gch).tt) {
      case '\x05':
        (o->h).gclist = g->gray;
        break;
      case '\x06':
        (o->h).metatable = (Table *)g->gray;
        break;
      default:
        goto switchD_001045ec_caseD_7;
      case '\b':
        (o->th).gclist = g->gray;
        break;
      case '\t':
        (o->p).gclist = g->gray;
        break;
      case '\n':
        pTVar2 = (o->h).metatable;
        iVar1._0_1_ = pTVar2->tt;
        iVar1._1_1_ = pTVar2->marked;
        iVar1._2_1_ = pTVar2->flags;
        iVar1._3_1_ = pTVar2->lsizenode;
        if ((3 < iVar1) && (((pTVar2->next->gch).marked & 3) != 0)) {
          reallymarkobject(g,pTVar2->next);
        }
        if ((o->h).metatable == (Table *)&(o->h).array) {
          (o->gch).marked = (o->gch).marked | 4;
        }
        goto switchD_001045ec_caseD_7;
      }
      g->gray = o;
      return;
    }
    o_00 = (GCObject *)(o->h).metatable;
    (o->gch).marked = bVar3 | 4;
    if ((o_00 != (GCObject *)0x0) && (((o_00->gch).marked & 3) != 0)) {
      reallymarkobject(g,o_00);
    }
    o = (GCObject *)(o->h).array;
  } while (((o->gch).marked & 3) != 0);
switchD_001045ec_caseD_7:
  return;
}

Assistant:

static void reallymarkobject(global_State*g,GCObject*o){
white2gray(o);
switch(o->gch.tt){
case 4:{
return;
}
case 7:{
Table*mt=gco2u(o)->metatable;
gray2black(o);
if(mt)markobject(g,mt);
markobject(g,gco2u(o)->env);
return;
}
case(8+2):{
UpVal*uv=gco2uv(o);
markvalue(g,uv->v);
if(uv->v==&uv->u.value)
gray2black(o);
return;
}
case 6:{
gco2cl(o)->c.gclist=g->gray;
g->gray=o;
break;
}
case 5:{
gco2h(o)->gclist=g->gray;
g->gray=o;
break;
}
case 8:{
gco2th(o)->gclist=g->gray;
g->gray=o;
break;
}
case(8+1):{
gco2p(o)->gclist=g->gray;
g->gray=o;
break;
}
default:;
}
}